

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<capnp::CallContextHook>>
          (Promise<void> *this,Own<capnp::CallContextHook> *attachments)

{
  AttachmentPromiseNode<kj::Own<capnp::CallContextHook>_> *pAVar1;
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>_>_> local_38;
  Own<capnp::CallContextHook> local_28;
  Own<kj::_::PromiseNode> local_18;
  
  local_28.disposer = (Disposer *)*in_RDX;
  local_28.ptr = (CallContextHook *)in_RDX[1];
  in_RDX[1] = 0;
  heap<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>>,kj::Own<kj::_::PromiseNode>,kj::Own<capnp::CallContextHook>>
            ((kj *)&local_38,(Own<kj::_::PromiseNode> *)attachments,&local_28);
  pAVar1 = local_38.ptr;
  local_18.disposer = local_38.disposer;
  local_38.ptr = (AttachmentPromiseNode<kj::Own<capnp::CallContextHook>_> *)0x0;
  (this->super_PromiseBase).node.disposer = local_38.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)pAVar1;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_18);
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>_>_>::dispose(&local_38);
  Own<capnp::CallContextHook>::dispose(&local_28);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}